

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.h
# Opt level: O2

void sip_round(siphash *H,int rounds)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar1 = 0;
  if (0 < rounds) {
    iVar1 = rounds;
  }
  while (bVar7 = iVar1 != 0, iVar1 = iVar1 + -1, bVar7) {
    uVar2 = H->v1;
    uVar3 = H->v0 + uVar2;
    uVar4 = H->v3;
    uVar2 = (uVar2 << 0xd | uVar2 >> 0x33) ^ uVar3;
    uVar6 = H->v2 + uVar4;
    uVar5 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar6;
    uVar4 = (uVar3 << 0x20 | uVar3 >> 0x20) + uVar5;
    H->v0 = uVar4;
    H->v3 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ uVar4;
    uVar6 = uVar6 + uVar2;
    H->v1 = (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar6;
    H->v2 = uVar6 << 0x20 | uVar6 >> 0x20;
  }
  return;
}

Assistant:

static void
sip_round(struct siphash *H, const int rounds) {
  int i;

  for (i = 0; i < rounds; i++) {
    H->v0 += H->v1;
    H->v1 = SIP_ROTL(H->v1, 13);
    H->v1 ^= H->v0;
    H->v0 = SIP_ROTL(H->v0, 32);

    H->v2 += H->v3;
    H->v3 = SIP_ROTL(H->v3, 16);
    H->v3 ^= H->v2;

    H->v0 += H->v3;
    H->v3 = SIP_ROTL(H->v3, 21);
    H->v3 ^= H->v0;

    H->v2 += H->v1;
    H->v1 = SIP_ROTL(H->v1, 17);
    H->v1 ^= H->v2;
    H->v2 = SIP_ROTL(H->v2, 32);
  }
}